

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Platform.h
# Opt level: O3

bool __thiscall
senjo::NumberParam<unsigned_long>
          (senjo *this,string *name,unsigned_long *value,char **params,bool *invalid)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  char cVar4;
  unsigned_long uVar5;
  char *pcVar6;
  char *pcVar7;
  
  if ((((name == (string *)0x0) || (pcVar7 = *params, pcVar7 == (char *)0x0)) ||
      (iVar1 = strncmp(pcVar7,(char *)this,(size_t)name), iVar1 != 0)) ||
     ((pcVar7[(long)name] != '\0' && (iVar1 = isspace((int)pcVar7[(long)name]), iVar1 == 0)))) {
    bVar3 = false;
  }
  else {
    *params = pcVar7 + (long)&name->_M_dataplus;
    cVar4 = pcVar7[(long)&name->_M_dataplus];
    if (cVar4 != '\0') {
      pcVar7 = pcVar7 + (long)&name->_M_dataplus;
      do {
        pcVar6 = pcVar7 + 1;
        iVar1 = isspace((int)cVar4);
        if (iVar1 == 0) {
          if (cVar4 == '-') {
            *params = pcVar6;
            cVar4 = *pcVar6;
            lVar2 = -1;
            pcVar7 = pcVar6;
          }
          else {
            lVar2 = 1;
          }
          if ((int)cVar4 - 0x30U < 10) {
            pcVar6 = pcVar7 + 1;
            *params = pcVar6;
            uVar5 = (long)*pcVar7 - 0x30;
            *value = uVar5;
            cVar4 = pcVar7[1];
            iVar1 = (int)cVar4;
            if (iVar1 - 0x30U < 10) {
              pcVar7 = pcVar7 + 2;
              do {
                pcVar6 = pcVar7;
                *params = pcVar6;
                uVar5 = (long)pcVar6[-1] + -0x30 + uVar5 * 10;
                *value = uVar5;
                cVar4 = *pcVar6;
                iVar1 = (int)cVar4;
                pcVar7 = pcVar6 + 1;
              } while (iVar1 - 0x30U < 10);
            }
            if ((cVar4 == '\0') || (iVar1 = isspace(iVar1), iVar1 != 0)) {
              *value = uVar5 * lVar2;
              cVar4 = *pcVar6;
              if (cVar4 == '\0') {
                return true;
              }
              do {
                pcVar6 = pcVar6 + 1;
                iVar1 = isspace((int)cVar4);
                if (iVar1 == 0) {
                  return true;
                }
                *params = pcVar6;
                cVar4 = *pcVar6;
              } while (cVar4 != '\0');
              return true;
            }
          }
          break;
        }
        *params = pcVar6;
        cVar4 = *pcVar6;
        pcVar7 = pcVar6;
      } while (cVar4 != '\0');
    }
    *invalid = true;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

static inline bool NumberParam(const std::string& name, Number& value,
                               const char*& params, bool& invalid)
{
  if (!ParamMatch(name, params)) {
    return false;
  }
  int sign = 1;
  if (params && (*params == '-')) {
    sign = -1;
    ++params;
  }
  if (!params || !*params || !isdigit(*params)) {
    invalid = true;
  }
  else {
    value = (*params++ - '0');
    while (*params && isdigit(*params)) {
      value = ((10 * value) + (*params++ - '0'));
    }
    if (*params && !isspace(*params)) {
      invalid = true;
    }
    else {
      value *= sign;
      NextWord(params);
    }
  }
  return true;
}